

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O3

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::ProtoStreamObjectSource
          (ProtoStreamObjectSource *this,CodedInputStream *stream,TypeResolver *type_resolver,
          Type *type)

{
  TypeInfo *pTVar1;
  LogMessage *other;
  LogMessage local_60;
  LogFinisher local_21;
  
  (this->super_ObjectSource)._vptr_ObjectSource =
       (_func_int **)&PTR__ProtoStreamObjectSource_003bd050;
  this->stream_ = stream;
  pTVar1 = TypeInfo::NewTypeInfo(type_resolver);
  this->typeinfo_ = pTVar1;
  this->own_typeinfo_ = true;
  this->type_ = type;
  this->use_lower_camel_for_enums_ = false;
  this->use_ints_for_enums_ = false;
  this->preserve_proto_field_names_ = false;
  this->recursion_depth_ = 0;
  this->max_recursion_depth_ = 0x40;
  this->render_unknown_fields_ = false;
  this->render_unknown_enum_values_ = true;
  this->add_trailing_zeros_for_timestamp_and_duration_ = false;
  this->suppress_empty_object_ = false;
  this->use_legacy_json_map_format_ = false;
  if (stream == (CodedInputStream *)0x0) {
    protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/util/internal/protostream_objectsource.cc"
               ,0x85);
    other = protobuf::internal::LogMessage::operator<<(&local_60,"Input stream is nullptr.");
    protobuf::internal::LogFinisher::operator=(&local_21,other);
    protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  return;
}

Assistant:

ProtoStreamObjectSource::ProtoStreamObjectSource(
    io::CodedInputStream* stream, TypeResolver* type_resolver,
    const google::protobuf::Type& type)
    : stream_(stream),
      typeinfo_(TypeInfo::NewTypeInfo(type_resolver)),
      own_typeinfo_(true),
      type_(type),
      use_lower_camel_for_enums_(false),
      use_ints_for_enums_(false),
      preserve_proto_field_names_(false),
      recursion_depth_(0),
      max_recursion_depth_(kDefaultMaxRecursionDepth),
      render_unknown_fields_(false),
      render_unknown_enum_values_(true),
      add_trailing_zeros_for_timestamp_and_duration_(false),
      suppress_empty_object_(false),
      use_legacy_json_map_format_(false) {
  GOOGLE_LOG_IF(DFATAL, stream == nullptr) << "Input stream is nullptr.";
}